

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::streamReconstructedExpression
          (BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDX;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *value;
  string *in_R9;
  StringRef op;
  type local_60;
  type local_40;
  
  StringMaker<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,void>
  ::convert<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
            (&local_40,
             (StringMaker<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,void>
              *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,void>
  ::convert<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
            (&local_60,
             (StringMaker<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,void>
              *)this->m_rhs,value);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }